

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

SockAddr * AGSSock::Socket_get_Local(Socket *sock)

{
  SockAddr *pSVar1;
  int *piVar2;
  socklen_t addrlen;
  socklen_t local_c;
  
  if (sock->local != (SockAddr *)0x0) {
    return sock->local;
  }
  pSVar1 = SockAddr_Create((long)sock->type);
  sock->local = pSVar1;
  (**(code **)(*AGSSockAPI::engine + 0x250))(AGSSockAPI::engine,pSVar1);
  local_c = 0x80;
  getsockname(sock->id,(sockaddr *)sock->local,&local_c);
  piVar2 = __errno_location();
  sock->error = *piVar2;
  return sock->local;
}

Assistant:

SockAddr *Socket_get_Local(Socket *sock)
{
	if (sock->local == nullptr)
	{
		sock->local = SockAddr_Create(sock->type);
		AGS_HOLD(sock->local);
		
		Socket_update_Local(sock);
		sock->error = GET_ERROR();
	}
	return sock->local;
}